

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

sqlite3_vfs * sqlite3_vfs_find(char *zVfs)

{
  int iVar1;
  sqlite3_mutex *psVar2;
  sqlite3_vfs *psVar3;
  
  iVar1 = sqlite3_initialize();
  if (iVar1 == 0) {
    if (sqlite3Config.bCoreMutex == '\0') {
      psVar2 = (sqlite3_mutex *)0x0;
    }
    else {
      psVar2 = (*sqlite3Config.mutex.xMutexAlloc)(2);
    }
    if (psVar2 != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(psVar2);
    }
    psVar3 = vfsList;
    if (vfsList != (sqlite3_vfs *)0x0 && zVfs != (char *)0x0) {
      do {
        iVar1 = strcmp(zVfs,psVar3->zName);
        if ((iVar1 == 0) || (psVar3 = psVar3->pNext, zVfs == (char *)0x0)) break;
      } while (psVar3 != (sqlite3_vfs *)0x0);
    }
    if (psVar2 != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(psVar2);
    }
  }
  else {
    psVar3 = (sqlite3_vfs *)0x0;
  }
  return psVar3;
}

Assistant:

SQLITE_API sqlite3_vfs *sqlite3_vfs_find(const char *zVfs){
  sqlite3_vfs *pVfs = 0;
#if SQLITE_THREADSAFE
  sqlite3_mutex *mutex;
#endif
#ifndef SQLITE_OMIT_AUTOINIT
  int rc = sqlite3_initialize();
  if( rc ) return 0;
#endif
#if SQLITE_THREADSAFE
  mutex = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_MAIN);
#endif
  sqlite3_mutex_enter(mutex);
  for(pVfs = vfsList; pVfs; pVfs=pVfs->pNext){
    if( zVfs==0 ) break;
    if( strcmp(zVfs, pVfs->zName)==0 ) break;
  }
  sqlite3_mutex_leave(mutex);
  return pVfs;
}